

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  int *piVar4;
  ulong uVar5;
  bool bVar6;
  thread streamer;
  StreamClient stream;
  allocator aStack_40231;
  thread tStack_40230;
  code *pcStack_40228;
  char *pcStack_40220;
  StreamMetaCb_t SStack_40218;
  _Bind<int_(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  _Stack_401f0;
  undefined1 *apuStack_40190 [2];
  undefined1 auStack_40180 [16];
  StreamClient SStack_40170;
  
  bVar6 = true;
  if (1 < argc) {
    std::__cxx11::string::string((string *)apuStack_40190,argv[1],&aStack_40231);
    iVar1 = std::__cxx11::string::compare((char *)apuStack_40190);
    bVar6 = iVar1 == 0;
    if (apuStack_40190[0] != auStack_40180) {
      operator_delete(apuStack_40190[0]);
    }
  }
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time"
               ,100);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"syntax: ",8);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x139250);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <stream server address> <cycle time in ms (default is ",0x37)
    ;
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")>",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return 0;
  }
  if ((main::address_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&main::address_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string
              ((string *)&main::address_abi_cxx11_,argv[1],(allocator *)&SStack_40170);
    __cxa_atexit(std::__cxx11::string::~string,&main::address_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&main::address_abi_cxx11_);
  }
  uVar5 = 3000;
  if (2 < argc) {
    iVar1 = atoi(argv[2]);
    uVar5 = (ulong)iVar1;
  }
  hbm::streaming::StreamClient::StreamClient(&SStack_40170);
  SStack_40218.super__Function_base._M_functor._8_8_ = 0;
  SStack_40218.super__Function_base._M_functor._M_unused._M_object = streamMetaInformationCb;
  SStack_40218._M_invoker =
       std::
       _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
       ::_M_invoke;
  SStack_40218.super__Function_base._M_manager =
       std::
       _Function_handler<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&),_void_(*)(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
       ::_M_manager;
  hbm::streaming::StreamClient::setStreamMetaCb(&SStack_40170,&SStack_40218);
  if (SStack_40218.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*SStack_40218.super__Function_base._M_manager)
              ((_Any_data *)&SStack_40218,(_Any_data *)&SStack_40218,__destroy_functor);
  }
  pcStack_40228 = (code *)(uVar5 / 1000);
  do {
    _Stack_401f0._M_f = (offset_in_StreamClient_to_subr)hbm::streaming::StreamClient::start;
    _Stack_401f0._8_8_ = 0;
    pcStack_40220 = "";
    std::
    _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   *)&_Stack_401f0._M_bound_args,&main::address_abi_cxx11_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  hbm::streaming::DAQSTREAM_PORT_abi_cxx11_,&pcStack_40220);
    _Stack_401f0._M_bound_args.
    super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    .super__Head_base<0UL,_hbm::streaming::StreamClient_*,_false>._M_head_impl = &SStack_40170;
    std::thread::
    thread<std::_Bind<int(hbm::streaming::StreamClient::*(hbm::streaming::StreamClient*,std::__cxx11::string,std::__cxx11::string,char_const*))(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>,,void>
              (&tStack_40230,&_Stack_401f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_401f0._M_bound_args.
           super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
           .
           super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
           .
           super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&_Stack_401f0._M_bound_args.
                   super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   .
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl + 0x10U)) {
      operator_delete(_Stack_401f0._M_bound_args.
                      super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      .
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      .
                      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_401f0._M_bound_args.
           super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
           .
           super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&_Stack_401f0._M_bound_args.
                   super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   .
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   .
                   super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                   .
                   super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           + 0x10U)) {
      operator_delete(_Stack_401f0._M_bound_args.
                      super__Tuple_impl<0UL,_hbm::streaming::StreamClient_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      .
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      .
                      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      .
                      super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Started",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    if (0 < (long)uVar5) {
      _Stack_401f0._M_f = (offset_in_StreamClient_to_subr)pcStack_40228;
      _Stack_401f0._8_8_ = (uVar5 % 1000) * 1000000;
      do {
        iVar1 = nanosleep((timespec *)&_Stack_401f0,(timespec *)&_Stack_401f0);
        if (iVar1 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
    hbm::streaming::StreamClient::stop(&SStack_40170);
    std::thread::join();
    if (tStack_40230._M_id._M_thread != 0) {
      std::terminate();
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	std::chrono::milliseconds cycleTime(3000);

	if((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "periodically connects to a daq stream, subscribes all signals and disconnects after a specified time" << std::endl;
		std::cout << "syntax: " << argv[0] << " <stream server address> <cycle time in ms (default is " << cycleTime.count() << ")>" << std::endl;
		return EXIT_SUCCESS;
	}


	static const std::string address = argv[1];



	if(argc>2) {
		cycleTime = std::chrono::milliseconds(atoi(argv[2]));
	}

	hbm::streaming::StreamClient stream;
	stream.setStreamMetaCb(streamMetaInformationCb);
	do {
		std::thread streamer = std::thread(std::bind(&hbm::streaming::StreamClient::start, &stream, address, hbm::streaming::DAQSTREAM_PORT, ""));
		std::cout << "Started" << std::endl;
		std::this_thread::sleep_for(cycleTime);
		stream.stop();
		streamer.join();
	} while(true);
}